

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O0

void set_VOL(huc6280_state *info)

{
  huc6280_state *info_local;
  
  if (info->PsgVolumeEffect == 0) {
    info->VOL = 0.0078125;
  }
  else if (info->PsgVolumeEffect == 3) {
    info->VOL = info->Volume / 1.3333333333333333;
  }
  else {
    info->VOL = info->Volume / ((double)info->PsgVolumeEffect * 1.0);
  }
  return;
}

Assistant:

static void
set_VOL(huc6280_state* info)
{
	if (info->PsgVolumeEffect == 0)
		//info->VOL = 0.0; //ミュート
		info->VOL = 1.0 / 128.0;
	else if (info->PsgVolumeEffect == 3)
		info->VOL = info->Volume / (double)(OVERSAMPLE_RATE * 4.0/3.0); // 3/4。v1.29追加
	else
		info->VOL = info->Volume / (double)(OVERSAMPLE_RATE * info->PsgVolumeEffect); //Kitao追加。_PsgVolumeEffect=ボリューム調節効果。
}